

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool __thiscall ON_NurbsCurve::RemoveSpan(ON_NurbsCurve *this,int span_index)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  uint uVar13;
  char *sFormat;
  size_t __n;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  double *__src;
  double *pdVar18;
  double *pdVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  
  iVar9 = this->m_dim;
  uVar13 = (iVar9 + 1) - (uint)(this->m_is_rat == 0);
  uVar22 = 0;
  if (0 < iVar9) {
    uVar22 = uVar13;
  }
  iVar6 = this->m_order;
  if (1 < iVar6) {
    iVar5 = this->m_cv_count;
    if ((((0 < iVar9 && iVar6 <= iVar5) && ((int)uVar13 <= this->m_cv_stride)) &&
        (pdVar12 = this->m_knot, pdVar12 != (double *)0x0)) && (this->m_cv != (double *)0x0)) {
      if (span_index <= iVar5 - iVar6 && -1 < span_index) {
        if (iVar5 == iVar6) {
          sFormat = "Cannot remove the only span from a Bezier NURBS curve.";
          iVar9 = 0x1069;
          goto LAB_00552ee6;
        }
        __n = (ulong)uVar13 << 3;
        dVar1 = pdVar12[(ulong)(uint)(iVar6 + span_index) - 2];
        dVar2 = pdVar12[(ulong)(uint)(iVar6 + span_index) - 1];
        dVar25 = (double)(-(ulong)(dVar1 < dVar2) & (ulong)(dVar2 - dVar1));
        iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                          (this);
        iVar9 = this->m_order;
        iVar6 = this->m_cv_count;
        uVar13 = iVar6 - iVar9;
        if (span_index == 0) {
          uVar22 = 1;
          if (1 < (int)uVar13) {
            uVar22 = uVar13;
          }
          for (lVar11 = 1; lVar11 < (int)uVar13; lVar11 = lVar11 + 1) {
            dVar3 = this->m_knot[(long)iVar9 + lVar11 + -1];
            pdVar12 = this->m_knot + (long)iVar9 + lVar11 + -2;
            if (*pdVar12 <= dVar3 && dVar3 != *pdVar12) {
              uVar22 = (uint)lVar11;
              break;
            }
          }
          for (iVar9 = 0; (int)(uVar22 + iVar9) < iVar6; iVar9 = iVar9 + 1) {
            pdVar19 = this->m_cv;
            pdVar12 = pdVar19 + this->m_cv_stride * iVar9;
            if (pdVar19 == (double *)0x0) {
              pdVar12 = (double *)0x0;
            }
            pdVar18 = pdVar19 + (int)((uVar22 + iVar9) * this->m_cv_stride);
            if (pdVar19 == (double *)0x0) {
              pdVar18 = (double *)0x0;
            }
            memcpy(pdVar12,pdVar18,__n);
            iVar6 = this->m_cv_count;
          }
          iVar9 = this->m_order;
          pdVar12 = this->m_knot;
          for (uVar24 = (ulong)uVar22; (long)uVar24 < (long)(iVar6 + iVar9 + -2);
              uVar24 = uVar24 + 1) {
            uVar23 = -(ulong)(dVar2 == pdVar12[uVar22]);
            *pdVar12 = (double)(uVar23 & (ulong)dVar1 | ~uVar23 & (ulong)(pdVar12[uVar22] - dVar25))
            ;
            pdVar12 = pdVar12 + 1;
          }
          iVar6 = iVar6 - uVar22;
        }
        else if (span_index < (int)uVar13) {
          uVar15 = (iVar9 + span_index) - 2;
          uVar23 = (ulong)uVar15;
          uVar20 = iVar9 + -1 + span_index;
          pdVar12 = this->m_knot;
          uVar24 = uVar23;
          uVar13 = uVar20;
          do {
            uVar21 = (int)uVar15 >> 0x1f & uVar15;
            if ((int)uVar24 < 1) break;
            uVar21 = uVar13 - 1;
            lVar11 = uVar24 - 1;
            uVar24 = uVar24 - 1;
            uVar13 = uVar21;
          } while (pdVar12[(int)uVar15] < pdVar12[lVar11] || pdVar12[(int)uVar15] == pdVar12[lVar11]
                  );
          uVar15 = (iVar6 + iVar9) - 3;
          lVar10 = (long)(int)uVar20;
          lVar11 = lVar10;
          uVar13 = uVar15;
          if ((int)uVar15 < (int)uVar20) {
            uVar13 = uVar20;
          }
          do {
            uVar16 = uVar13;
            if ((int)uVar15 <= lVar11) break;
            lVar4 = lVar11 + 1;
            uVar16 = (int)uVar23 + 1;
            uVar23 = (ulong)uVar16;
            lVar11 = lVar11 + 1;
          } while (pdVar12[lVar4] < pdVar12[lVar10] || pdVar12[lVar4] == pdVar12[lVar10]);
          iVar6 = (uVar16 - uVar21) + 1;
          lVar11 = (long)(int)uVar21;
          if ((dVar25 <= 0.0) &&
             (((pdVar12[lVar11] != pdVar12[(int)uVar16] ||
               (NAN(pdVar12[lVar11]) || NAN(pdVar12[(int)uVar16]))) || (iVar6 < iVar9)))) {
            sFormat = "span_index parameter identifies an empty span.";
            iVar9 = 0x10aa;
            goto LAB_00552ee6;
          }
          iVar17 = iVar9 + -1;
          uVar13 = uVar21 - iVar17;
          iVar14 = iVar9;
          if ((int)uVar13 < 0) {
            pdVar12 = (double *)0x0;
          }
          else if ((int)(iVar9 + span_index + ~uVar21) < iVar17) {
            pdVar12 = (double *)onmalloc((long)(int)((uVar22 + 2) * iVar9) * 8 - 0x10);
            iVar14 = this->m_order;
            memcpy(pdVar12 + (long)(int)uVar22 * (long)iVar14,this->m_knot + uVar13,
                   (long)iVar14 * 0x10 - 0x10);
            pdVar19 = pdVar12;
            for (lVar10 = 0; iVar17 = this->m_order, lVar10 < iVar17; lVar10 = lVar10 + 1) {
              pdVar18 = this->m_cv + (long)(int)(uVar13 + (int)lVar10) * (long)this->m_cv_stride;
              if (this->m_cv == (double *)0x0) {
                pdVar18 = (double *)0x0;
              }
              memcpy(pdVar19,pdVar18,__n);
              pdVar19 = pdVar19 + uVar22;
            }
            ON_ClampKnotVector(uVar22,iVar17,iVar17,uVar22,pdVar12,
                               pdVar12 + (long)(int)uVar22 * (long)iVar14,1);
            iVar17 = this->m_order + -1;
            iVar14 = this->m_order;
          }
          else {
            pdVar12 = (double *)0x0;
          }
          iVar7 = iVar17 - iVar6;
          if (iVar7 != 0 && iVar6 <= iVar17) {
            ReserveCVCapacity(this,(this->m_cv_count + iVar7) * this->m_cv_stride);
            ReserveKnotCapacity(this,this->m_order + this->m_cv_count + iVar7 + -2);
            iVar14 = this->m_order;
            iVar8 = this->m_cv_count;
            pdVar19 = this->m_knot;
            for (lVar10 = (long)(iVar8 + iVar14 + -3); (int)((uVar16 + 2) - iVar14) <= lVar10;
                lVar10 = lVar10 + -1) {
              pdVar19[iVar7 + lVar10] = pdVar19[lVar10];
            }
            while ((int)((uVar16 + 2) - iVar14) < iVar8) {
              pdVar18 = this->m_cv;
              pdVar19 = pdVar18 + (int)((iVar8 + ((iVar17 + uVar21) - uVar16) + -2) *
                                       this->m_cv_stride);
              if (pdVar18 == (double *)0x0) {
                pdVar19 = (double *)0x0;
              }
              __src = pdVar18 + this->m_cv_stride * (iVar8 + -1);
              if (pdVar18 == (double *)0x0) {
                __src = (double *)0x0;
              }
              memcpy(pdVar19,__src,__n);
              iVar8 = iVar8 + -1;
              iVar14 = this->m_order;
            }
            uVar16 = uVar16 + iVar7;
            uVar20 = uVar20 + iVar7;
            this->m_cv_count = this->m_cv_count + iVar7;
          }
          if ((int)(uVar16 - uVar20) < iVar14 + -2) {
            ON_ClampKnotVector(uVar22,iVar14,iVar14,this->m_cv_stride,
                               this->m_cv + (int)(((uVar16 - iVar14) + 2) * this->m_cv_stride),
                               this->m_knot + (long)(int)(uVar16 - iVar14) + 2,0);
            iVar14 = this->m_order;
          }
          uVar13 = (uVar16 - iVar14) + 2;
          if (pdVar12 != (double *)0x0) {
            pdVar19 = pdVar12;
            iVar7 = iVar14;
            for (lVar10 = 0; lVar10 < iVar7 + -1; lVar10 = lVar10 + 1) {
              pdVar18 = this->m_cv +
                        (long)(int)((uVar21 - iVar9) + 1 + (int)lVar10) * (long)this->m_cv_stride;
              if (this->m_cv == (double *)0x0) {
                pdVar18 = (double *)0x0;
              }
              memcpy(pdVar18,pdVar19,__n);
              iVar7 = this->m_order;
              pdVar19 = pdVar19 + uVar22;
            }
            onfree(pdVar12);
          }
          if ((int)uVar13 <= (int)uVar21) {
            if ((0.0 < dVar25) && (uVar21 == uVar13)) {
              iVar9 = this->m_order;
              iVar6 = this->m_cv_count;
              pdVar12 = this->m_knot;
              for (; lVar11 < iVar6 + iVar9 + -2; lVar11 = lVar11 + 1) {
                dVar3 = pdVar12[lVar11];
                uVar24 = -(ulong)(dVar2 == dVar3);
                pdVar12[lVar11] =
                     (double)(uVar24 & (ulong)dVar1 | ~uVar24 & (ulong)(dVar3 - dVar25));
              }
            }
            goto LAB_005535d3;
          }
          if (iVar6 < iVar17) {
            iVar6 = iVar17;
          }
          uVar22 = uVar21;
          while( true ) {
            iVar9 = (iVar6 - iVar14) + 1 + uVar22;
            iVar17 = this->m_cv_count;
            if (iVar17 <= iVar9) break;
            pdVar19 = this->m_cv;
            pdVar12 = pdVar19 + (int)(this->m_cv_stride * uVar22);
            if (pdVar19 == (double *)0x0) {
              pdVar12 = (double *)0x0;
            }
            pdVar18 = pdVar19 + iVar9 * this->m_cv_stride;
            if (pdVar19 == (double *)0x0) {
              pdVar18 = (double *)0x0;
            }
            memcpy(pdVar12,pdVar18,__n);
            uVar22 = uVar22 + 1;
          }
          iVar9 = this->m_order;
          pdVar19 = this->m_knot;
          pdVar12 = pdVar19 + (int)uVar21;
          for (lVar11 = (long)(int)uVar13; lVar11 < iVar17 + iVar9 + -2; lVar11 = lVar11 + 1) {
            dVar3 = pdVar19[lVar11];
            uVar24 = -(ulong)(dVar2 == dVar3);
            *pdVar12 = (double)(uVar24 & (ulong)dVar1 | ~uVar24 & (ulong)(dVar3 - dVar25));
            pdVar12 = pdVar12 + 1;
          }
          iVar6 = iVar17 + (uVar21 - (uVar16 - iVar14)) + -2;
        }
        else {
          lVar11 = (long)(int)uVar13;
          pdVar12 = this->m_knot + (long)iVar6 + -2;
          do {
            iVar6 = iVar6 + -1;
            if (lVar11 < 2) break;
            dVar1 = *pdVar12;
            lVar11 = lVar11 + -1;
            pdVar19 = pdVar12 + -1;
            pdVar12 = pdVar12 + -1;
          } while (dVar1 < *pdVar19 || dVar1 == *pdVar19);
        }
        this->m_cv_count = iVar6;
LAB_005535d3:
        if (((char)iVar5 != '\0') &&
           (iVar9 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35]
                    )(this), (char)iVar9 != '\0')) {
          return true;
        }
        ClampEnd(this,2);
        return true;
      }
      sFormat = "span_index parameter is out of range.";
      iVar9 = 0x1063;
      goto LAB_00552ee6;
    }
  }
  sFormat = "Invalid NURBS curve.";
  iVar9 = 0x105d;
LAB_00552ee6:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
             ,iVar9,"",sFormat);
  return false;
}

Assistant:

bool ON_NurbsCurve::RemoveSpan(
  int span_index 
  )
{
  const int cv_size = CVSize();
  if (    m_order < 2 
       || m_cv_count < m_order
       || m_dim <= 0
       || cv_size > m_cv_stride 
       || 0 == m_knot
       || 0 == m_cv
       )
  {
    ON_ERROR("Invalid NURBS curve.");
    return false;
  }

  if ( span_index < 0 || span_index > m_cv_count-m_order )
  {
    ON_ERROR("span_index parameter is out of range.");
    return false;
  }

  if ( m_cv_count == m_order )
  {
    ON_ERROR("Cannot remove the only span from a Bezier NURBS curve.");
    return false;
  }

  const size_t sizeof_cv = cv_size*sizeof(m_cv[0]);
  int i, j;

  const double knot0 = m_knot[span_index+m_order-2];
  const double knot1 = m_knot[span_index+m_order-1];
  const double knot_delta = (knot0 < knot1) ? (knot1 - knot0) : 0.0;

  const bool bIsPeriodic0 = IsPeriodic()?true:false;

  if ( span_index <= 0 )
  {
    // remove initial span
    // set span_index = index of the span to keep.
    for ( span_index = 1; span_index < m_cv_count-m_order; span_index++ )
    {
      if ( m_knot[span_index+m_order-2] < m_knot[span_index+m_order-1] )
        break;
    }
    for ( i = 0; i+span_index < m_cv_count; i++ )
      memcpy(CV(i),CV(i+span_index),sizeof_cv);
    for ( i = 0; i+span_index < m_cv_count+m_order-2; i++ )
    {
      m_knot[i] = (knot1 == m_knot[i+span_index])
                ? knot0
                : (m_knot[i+span_index] - knot_delta);
    }
    m_cv_count -= span_index;
  }
  else if ( span_index >= m_cv_count-m_order )
  {
    // remove final span
    // set span_index = index of the span to keep.
    for ( span_index = m_cv_count-m_order-1; span_index > 0; span_index-- )
    {
      if ( m_knot[span_index+m_order-2] < m_knot[span_index+m_order-1] )
        break;
    }
    m_cv_count = span_index+m_order;
  }
  else
  {
    // remove interior span
    int k0 = span_index+m_order-2;
    int k1 = span_index+m_order-1;
    int i0 = k0;
    int i1 = k1;
    for ( i0 = k0; i0 > 0; i0-- )
    {
      if ( m_knot[i0-1] < m_knot[k0] )
        break;
    }
    for ( i1 = k1; i1 < m_cv_count+m_order-3; i1++ )
    {
      if ( m_knot[i1+1] > m_knot[k1] )
        break;
    }
    int m = (i1-i0+1);
    if ( !(knot_delta > 0.0) )
    {
      if ( !(m_knot[i0] == m_knot[i1]) || m < m_order )
      {
        ON_ERROR("span_index parameter identifies an empty span.");
        return false;
      }
    }

    int span_index0 = i0 - (m_order-1);
    double* cv0 = 0;
    if ( span_index0 >= 0 && k0 - i0 + 1 < m_order-1 )
    {
      cv0 = (double*)onmalloc( (m_order*cv_size + 2*m_order-2)*sizeof(cv0[0]) );
      double* knot0_local = cv0 + (m_order*cv_size);
      memcpy( knot0_local, m_knot+span_index0, (2*m_order-2)*sizeof(knot0_local[0]) );
      for ( i = 0; i < m_order; i++ )
        memcpy( cv0 + (i*cv_size), CV(span_index0+i), sizeof_cv );
      ON_ClampKnotVector( cv_size, m_order, m_order, cv_size, cv0, knot0_local, 1 );
    }

    if ( m < m_order-1 )
    {
      i = m_order-1 - m;
      ReserveCVCapacity( m_cv_stride*(m_cv_count+i) );
      ReserveKnotCapacity( m_cv_count+m_order-2+i );
      for ( j = m_cv_count+m_order-3; j >= i1-m_order+2; j-- )
        m_knot[j+i] = m_knot[j];
      for ( j = m_cv_count-1; j >= i1-m_order+2; j-- )
        memcpy(CV(j+i),CV(j),sizeof_cv);
      i1 += i;
      k1 += i;
      m_cv_count += i;
    }

    if ( i1-k1 < m_order-2 )
      ON_ClampKnotVector( cv_size, m_order, m_order, m_cv_stride, 
                          m_cv + ((i1-m_order+2)*m_cv_stride), 
                          m_knot + (i1-m_order+2), 
                          0 );

    k0 = i0;
    k1 = i1-m_order+2;

    if ( 0 != cv0 )
    {
      for ( i = 0; i < m_order-1; i++ )
        memcpy(CV(i+span_index0),cv0 + (i*cv_size),sizeof_cv);
      onfree(cv0);
      cv0 = 0;
    }

    if ( k0 < k1 )
    {
      for ( i = 0; i + k1 < m_cv_count; i++ )
        memcpy(CV(i+k0),CV(i+k1),sizeof_cv);
      for ( i = 0; i + k1 < m_cv_count+m_order-2; i++ )
      {
        m_knot[i+k0] = (knot1 == m_knot[i+k1]) 
                     ? knot0
                     : (m_knot[i+k1] - knot_delta);
      }
      m_cv_count -= (k1-k0);
    }
    else if ( k0 == k1 && knot_delta > 0.0 )
    {
      for ( i = k0; i < m_cv_count+m_order-2; i++ )
      {
        m_knot[i] = (knot1 == m_knot[i])
                  ? knot0
                  : (m_knot[i] - knot_delta);
      }
    }
  }

  if ( false == bIsPeriodic0 || false == IsPeriodic() )
    ClampEnd(2);

  return true;
}